

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O1

BufferHandle * __thiscall
duckdb::TupleDataAllocator::PinHeapBlock
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkPart *part)

{
  pointer ppVar1;
  uint32_t *__args;
  pointer ppVar2;
  BufferHandle BStack_38;
  
  __args = &part->heap_block_index;
  ppVar2 = (pin_state->heap_handles).handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (pin_state->heap_handles).handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    do {
      if (ppVar2->first == *__args) break;
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
  }
  if (ppVar2 == ppVar1) {
    (*this->buffer_manager->_vptr_BufferManager[7])
              (&BStack_38,this->buffer_manager,
               (this->heap_blocks).
               super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               _M_impl.super__Vector_impl_data._M_start + *__args);
    ::std::
    vector<std::pair<unsigned_int,duckdb::BufferHandle>,std::allocator<std::pair<unsigned_int,duckdb::BufferHandle>>>
    ::emplace_back<unsigned_int_const&,duckdb::BufferHandle>
              ((vector<std::pair<unsigned_int,duckdb::BufferHandle>,std::allocator<std::pair<unsigned_int,duckdb::BufferHandle>>>
                *)&pin_state->heap_handles,__args,&BStack_38);
    ppVar2 = (pin_state->heap_handles).handles.
             super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             .
             super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    BufferHandle::~BufferHandle(&BStack_38);
  }
  return &ppVar2->second;
}

Assistant:

BufferHandle &TupleDataAllocator::PinHeapBlock(TupleDataPinState &pin_state, const TupleDataChunkPart &part) {
	const auto &heap_block_index = part.heap_block_index;
	auto it = pin_state.heap_handles.find(heap_block_index);
	if (it == pin_state.heap_handles.end()) {
		D_ASSERT(heap_block_index < heap_blocks.size());
		auto &heap_block = heap_blocks[heap_block_index];
		D_ASSERT(heap_block.handle);
		D_ASSERT(part.heap_block_offset < heap_block.size);
		D_ASSERT(part.heap_block_offset + part.total_heap_size <= heap_block.size);
		it = pin_state.heap_handles.emplace(heap_block_index, buffer_manager.Pin(heap_block.handle)).first;
	}
	return it->second;
}